

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwNoMansLand(int level)

{
  int iVar1;
  int level_local;
  
  mwAutoInit();
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  if (level == 0) {
    mwDrop_(0,0xfc,0);
    iVar1 = level;
  }
  else {
    iVar1 = level;
    if ((level != 1) && (iVar1 = mwNML, level == 2)) {
      mwGrab_(0,0xfc,0);
      iVar1 = level;
    }
  }
  mwNML = iVar1;
  return;
}

Assistant:

void mwNoMansLand(int level)
{
	mwAutoInit();
	TESTS(NULL, 0);
	switch (level) {
		case MW_NML_NONE:
			(void) mwDrop_(0, MW_VAL_NML, 0);
			break;
		case MW_NML_FREE:
			break;
		case MW_NML_ALL:
			(void) mwGrab_(0, MW_VAL_NML, 0);
			break;
		default:
			return;
	}
	mwNML = level;
}